

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiclock.cpp
# Opt level: O3

int clock_in(void)

{
  bool bVar1;
  RtMidiIn *rtmidi;
  uint clock_count;
  char input;
  long *local_40 [2];
  long local_30 [2];
  
  rtmidi = (RtMidiIn *)operator_new(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"RtMidi Input Client","");
  RtMidiIn::RtMidiIn(rtmidi,0,local_40,100);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  bVar1 = choosePort<RtMidiIn>(rtmidi,"input");
  if (bVar1) {
    MidiInApi::setCallback(*(_func_void_double_vector_ptr_void_ptr **)(rtmidi + 8),mycallback);
    (**(code **)(**(long **)(rtmidi + 8) + 0x58))(*(long **)(rtmidi + 8),0,0,0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nReading MIDI input ... press <enter> to quit.\n",0x2f);
    std::istream::get((char *)&std::cin);
  }
  (**(code **)(*(long *)rtmidi + 0x40))(rtmidi);
  return 0;
}

Assistant:

int clock_in()
{
  RtMidiIn *midiin = 0;
  unsigned int clock_count = 0;

  try {

    // RtMidiIn constructor
    midiin = new RtMidiIn();

    // Call function to select port.
    if ( chooseInputPort( midiin ) == false ) goto cleanup;

    // Set our callback function.  This should be done immediately after
    // opening the port to avoid having incoming messages written to the
    // queue instead of sent to the callback function.
    midiin->setCallback( &mycallback, &clock_count );

    // Don't ignore sysex, timing, or active sensing messages.
    midiin->ignoreTypes( false, false, false );

    std::cout << "\nReading MIDI input ... press <enter> to quit.\n";
    char input;
    std::cin.get(input);

  } catch ( RtMidiError &error ) {
    error.printMessage();
  }

 cleanup:

  delete midiin;

  return 0;
}